

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

void mg_set_thread_name(char *name)

{
  pthread_t __target_thread;
  char threadName [17];
  char acStack_28 [32];
  
  mg_snprintf((mg_connection *)0x0,(int *)0x0,acStack_28,0x11,"civetweb-%s",name);
  __target_thread = pthread_self();
  pthread_setname_np(__target_thread,acStack_28);
  return;
}

Assistant:

static void
mg_set_thread_name(const char *name)
{
	char threadName[16 + 1]; /* 16 = Max. thread length in Linux/OSX/.. */

	mg_snprintf(
	    NULL, NULL, threadName, sizeof(threadName), "civetweb-%s", name);

#if defined(_WIN32)
#if defined(_MSC_VER)
	/* Windows and Visual Studio Compiler */
	__try {
		THREADNAME_INFO info;
		info.dwType = 0x1000;
		info.szName = threadName;
		info.dwThreadID = ~0U;
		info.dwFlags = 0;

		RaiseException(0x406D1388,
		               0,
		               sizeof(info) / sizeof(ULONG_PTR),
		               (ULONG_PTR *)&info);
	} __except (EXCEPTION_EXECUTE_HANDLER) {
	}
#elif defined(__MINGW32__)
	/* No option known to set thread name for MinGW known */
#endif
#elif defined(_GNU_SOURCE) && defined(__GLIBC__)                               \
    && ((__GLIBC__ > 2) || ((__GLIBC__ == 2) && (__GLIBC_MINOR__ >= 12)))
	/* pthread_setname_np first appeared in glibc in version 2.12 */
#if defined(__MACH__) && defined(__APPLE__)
	/* OS X only current thread name can be changed */
	(void)pthread_setname_np(threadName);
#else
	(void)pthread_setname_np(pthread_self(), threadName);
#endif
#elif defined(__linux__)
	/* On Linux we can use the prctl function.
	 * When building for Linux Standard Base (LSB) use
	 * NO_THREAD_NAME. However, thread names are a big
	 * help for debugging, so the stadard is to set them.
	 */
	(void)prctl(PR_SET_NAME, threadName, 0, 0, 0);
#endif
}